

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall Annotations::Update(Annotations *this,int id,char *note)

{
  int iVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int r;
  char *zErrMsg;
  char sql [10240];
  undefined8 local_2820;
  undefined1 local_2818 [10264];
  
  local_2820 = 0;
  sqlite3_snprintf(0x2800,local_2818,"UPDATE annotations set note = \'%q\' where id=%d;",in_RDX,
                   in_ESI);
  iVar1 = sqlite3_exec(*(undefined8 *)(in_RDI + 0x20),local_2818,0,0,&local_2820);
  if (iVar1 == 0) {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stdout,"Records created successfully\n");
    }
  }
  else {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stderr,"SQL error: %s\n",local_2820);
    }
    sqlite3_free(local_2820);
  }
  return;
}

Assistant:

void Annotations::Update(int id, char *note) {
	char sql[10240];
	char *zErrMsg = 0;
	int r;

	sqlite3_snprintf(sizeof(sql), sql, "UPDATE annotations set note = '%q' where id=%d;", note, id);
	r = sqlite3_exec(sqldb, sql, NULL, 0, &zErrMsg);
	if (r != SQLITE_OK) {
		if (debug) fprintf(stderr, "SQL error: %s\n", zErrMsg);
		sqlite3_free(zErrMsg);
	} else {
		if (debug) fprintf(stdout, "Records created successfully\n");
	}
}